

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QCursor *c)

{
  bool bVar1;
  CursorShape CVar2;
  int iVar3;
  QDataStream *stream;
  QPixmap *in_RDI;
  long in_FS_OFFSET;
  bool isPixmap;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 i;
  QPixmap *in_stack_ffffffffffffff50;
  QPixmap *pQVar4;
  QPixmap *in_stack_ffffffffffffff58;
  QDataStream *in_stack_ffffffffffffff60;
  byte local_81;
  QPoint local_70 [13];
  long local_8;
  
  i = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CVar2 = QCursor::shape((QCursor *)in_stack_ffffffffffffff50);
  QDataStream::operator<<((QDataStream *)in_RDI,(short)CVar2);
  CVar2 = QCursor::shape((QCursor *)in_stack_ffffffffffffff50);
  if (CVar2 == BitmapCursor) {
    local_81 = 0;
    iVar3 = QDataStream::version((QDataStream *)in_RDI);
    if (6 < iVar3) {
      QCursor::pixmap((QCursor *)in_stack_ffffffffffffff58);
      bVar1 = QPixmap::isNull(in_stack_ffffffffffffff50);
      local_81 = (bVar1 ^ 0xffU) & 1;
      QPixmap::~QPixmap(in_stack_ffffffffffffff50);
      QDataStream::operator<<<bool,_true>((QDataStream *)in_stack_ffffffffffffff50,(bool)i);
    }
    if (local_81 == 0) {
      pQVar4 = in_RDI;
      QCursor::bitmap((QCursor *)in_RDI);
      stream = operator<<(in_stack_ffffffffffffff60,pQVar4);
      QCursor::mask((QCursor *)pQVar4);
      operator<<(stream,pQVar4);
      QBitmap::~QBitmap((QBitmap *)0x3411ee);
      QBitmap::~QBitmap((QBitmap *)0x3411f8);
    }
    else {
      QCursor::pixmap((QCursor *)in_stack_ffffffffffffff58);
      operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QPixmap::~QPixmap(in_stack_ffffffffffffff50);
    }
    pQVar4 = in_RDI;
    local_70[0] = QCursor::hotSpot((QCursor *)in_RDI);
    operator<<((QDataStream *)pQVar4,(QPoint *)local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDataStream *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QCursor &c)
{
    s << (qint16)c.shape();                        // write shape id to stream
    if (c.shape() == Qt::BitmapCursor) {                // bitmap cursor
        bool isPixmap = false;
        if (s.version() >= 7) {
            isPixmap = !c.pixmap().isNull();
            s << isPixmap;
        }
        if (isPixmap)
            s << c.pixmap();
        else
            s << c.bitmap() << c.mask();
        s << c.hotSpot();
    }
    return s;
}